

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

void anon_unknown.dwarf_375::printCompdb(char *directory,Edge *edge,EvaluateCommandMode eval_mode)

{
  char *pcVar1;
  const_reference ppNVar2;
  EvaluateCommandMode in_ECX;
  string local_40;
  EvaluateCommandMode local_1c;
  Edge *pEStack_18;
  EvaluateCommandMode eval_mode_local;
  Edge *edge_local;
  char *directory_local;
  
  local_1c = eval_mode;
  pEStack_18 = edge;
  edge_local = (Edge *)directory;
  printf("\n  {\n    \"directory\": \"");
  EncodeJSONString((char *)edge_local);
  printf("\",\n    \"command\": \"");
  (anonymous_namespace)::EvaluateCommandWithRspfile_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)pEStack_18,(Edge *)(ulong)local_1c,in_ECX);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  EncodeJSONString(pcVar1);
  std::__cxx11::string::~string((string *)&local_40);
  printf("\",\n    \"file\": \"");
  ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pEStack_18->inputs_,0);
  Node::path_abi_cxx11_(*ppNVar2);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  EncodeJSONString(pcVar1);
  printf("\",\n    \"output\": \"");
  ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pEStack_18->outputs_,0);
  Node::path_abi_cxx11_(*ppNVar2);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  EncodeJSONString(pcVar1);
  printf("\"\n  }");
  return;
}

Assistant:

void printCompdb(const char* const directory, const Edge* const edge,
                 const EvaluateCommandMode eval_mode) {
  printf("\n  {\n    \"directory\": \"");
  EncodeJSONString(directory);
  printf("\",\n    \"command\": \"");
  EncodeJSONString(EvaluateCommandWithRspfile(edge, eval_mode).c_str());
  printf("\",\n    \"file\": \"");
  EncodeJSONString(edge->inputs_[0]->path().c_str());
  printf("\",\n    \"output\": \"");
  EncodeJSONString(edge->outputs_[0]->path().c_str());
  printf("\"\n  }");
}